

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O2

void fiobj_ary_unshift(FIOBJ ary,FIOBJ obj)

{
  void *ptr;
  size_t sVar1;
  void *pvVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (ary != 0) {
    sVar1 = fiobj_type_is(ary,(fiobj_type_enum)obj);
    if (sVar1 != 0) {
      lVar4 = *(long *)(ary + 8);
      if (lVar4 == 0) {
        ptr = *(void **)(ary + 0x20);
        uVar6 = *(ulong *)(ary + 0x10);
        uVar8 = (uVar6 & 0xfffffffffffffffe) + 10;
        if (uVar8 < *(ulong *)(ary + 0x18)) {
          uVar5 = 0;
          pvVar2 = ptr;
          uVar8 = *(ulong *)(ary + 0x18);
          uVar7 = uVar6;
        }
        else {
          pvVar2 = fio_malloc(uVar8 * 8);
          *(void **)(ary + 0x20) = pvVar2;
          if (pvVar2 == (void *)0x0) {
            if (0 < FIO_LOG_LEVEL) {
              FIO_LOG2STDERR(
                            "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4933"
                            );
            }
            kill(0,2);
            piVar3 = __errno_location();
            exit(*piVar3);
          }
          *(ulong *)(ary + 0x18) = uVar8;
          uVar5 = *(ulong *)(ary + 8);
          uVar6 = *(ulong *)(ary + 0x10);
          uVar7 = uVar6 - uVar5;
        }
        *(ulong *)(ary + 0x10) = uVar8;
        if (uVar6 != uVar5) {
          memmove((void *)((long)pvVar2 + (uVar8 - uVar7) * 8),(void *)((long)ptr + uVar5 * 8),
                  uVar7 * 8);
          uVar8 = *(ulong *)(ary + 0x10);
          pvVar2 = *(void **)(ary + 0x20);
        }
        lVar4 = uVar8 - uVar7;
        *(long *)(ary + 8) = lVar4;
        if (ptr != pvVar2) {
          fio_free(ptr);
          lVar4 = *(long *)(ary + 8);
        }
      }
      *(long *)(ary + 8) = lVar4 + -1;
      *(FIOBJ *)(*(long *)(ary + 0x20) + -8 + lVar4 * 8) = obj;
      return;
    }
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0xab,"void fiobj_ary_unshift(FIOBJ, FIOBJ)");
}

Assistant:

void fiobj_ary_unshift(FIOBJ ary, FIOBJ obj) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  fio_ary___unshift(&obj2ary(ary)->ary, obj);
}